

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O3

void voutlet_dspprolog(_voutlet *x,t_signal **parentsigs,int myvecsize,int calcsize,int phase,
                      int period,int frequency,int downsample,int upsample,int reblock,int switched)

{
  int iVar1;
  t_signal *ptVar2;
  
  if (x->x_buf != (t_sample *)0x0) {
    (x->x_updown).downsample = downsample;
    (x->x_updown).upsample = upsample;
    x->x_justcopyout = reblock == 0 && switched != 0;
    if (reblock == 0) {
      if (parentsigs == (t_signal **)0x0) {
        bug("voutlet_dspprolog");
      }
      iVar1 = outlet_getsignalindex(x->x_parentoutlet);
      ptVar2 = parentsigs[iVar1];
    }
    else {
      ptVar2 = (t_signal *)0x0;
    }
    x->x_directsignal = ptVar2;
  }
  return;
}

Assistant:

void voutlet_dspprolog(struct _voutlet *x, t_signal **parentsigs,
    int myvecsize, int calcsize, int phase, int period, int frequency,
    int downsample, int upsample, int reblock, int switched)
{
        /* no buffer means we're not a signal outlet */
    if (!x->x_buf)
        return;
    x->x_updown.downsample=downsample;
    x->x_updown.upsample=upsample;
    x->x_justcopyout = (switched && !reblock);
    if (reblock)
    {
        x->x_directsignal = 0;
    }
    else
    {
        if (!parentsigs) bug("voutlet_dspprolog");
        x->x_directsignal =
            parentsigs[outlet_getsignalindex(x->x_parentoutlet)];
    }
}